

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O3

int __thiscall glslang::TProgram::link(TProgram *this,char *__from,char *__to)

{
  bool bVar1;
  bool bVar2;
  int s;
  EShLanguage stage;
  
  stage = EShLangVertex;
  if (this->linked == false) {
    this->linked = true;
    SetThreadPoolAllocator(this->pool);
    bVar1 = false;
    do {
      bVar2 = linkStage(this,stage,(EShMessages)__from);
      if (!bVar2) {
        bVar1 = true;
      }
      stage = stage + EShLangTessControl;
    } while (stage != EShLangCount);
    if (bVar1) {
      stage = EShLangVertex;
    }
    else {
      bVar2 = crossStageCheck(this,(EShMessages)__from);
      stage = (EShLanguage)((bVar1 ^ 1U) & bVar2);
    }
  }
  return stage;
}

Assistant:

bool TProgram::link(EShMessages messages)
{
    if (linked)
        return false;
    linked = true;

    bool error = false;

    SetThreadPoolAllocator(pool);

    for (int s = 0; s < EShLangCount; ++s) {
        if (! linkStage((EShLanguage)s, messages))
            error = true;
    }

    if (!error) {
        if (! crossStageCheck(messages))
            error = true;
    }

    return ! error;
}